

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O3

void pg::pm_stream(ostream *out,int *pm,int k)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  char *pcVar3;
  ulong uVar4;
  
  if (0 < k) {
    uVar4 = 0;
    do {
      if (pm[uVar4] == -1) {
        pcVar3 = " __";
LAB_001709a3:
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,3);
      }
      else {
        if (uVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\x1b[33;1m",7);
          std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
          pp_Var2 = out->_vptr_basic_ostream;
          p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var2[-3]);
          if ((&out->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
            std::ios::widen((char)p_Var1);
            p_Var1[0xe1] = (code)0x1;
            pp_Var2 = out->_vptr_basic_ostream;
          }
          p_Var1[0xe0] = (code)0x30;
          *(undefined8 *)(&out->field_0x10 + (long)pp_Var2[-3]) = 2;
          std::ostream::operator<<(out,*pm);
          pcVar3 = "\x1b[m";
          goto LAB_001709a3;
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
        pp_Var2 = out->_vptr_basic_ostream;
        p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var2[-3]);
        if ((&out->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
          std::ios::widen((char)p_Var1);
          p_Var1[0xe1] = (code)0x1;
          pp_Var2 = out->_vptr_basic_ostream;
        }
        p_Var1[0xe0] = (code)0x30;
        *(undefined8 *)(&out->field_0x10 + (long)pp_Var2[-3]) = 2;
        std::ostream::operator<<(out,pm[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while ((uint)k != uVar4);
  }
  return;
}

Assistant:

static void
pm_stream(std::ostream &out, int *pm, int k)
{
    for (int i=0; i<k; i++) {
        if (pm[i] != -1) {
            if (i == 0) out << "\033[33;1m";
            out << " " << std::setfill('0') << std::setw(2) << pm[i];
            if (i == 0) out << "\033[m";
        }
        else out << " __";
    }
}